

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void run_container_smart_append_exclusive(run_container_t *src,uint16_t start,uint16_t length)

{
  uint16_t uVar1;
  uint16_t uVar2;
  rle16_t rVar3;
  rle16_t rVar4;
  rle16_t rVar5;
  rle16_t rVar6;
  uint uVar7;
  rle16_t *prVar8;
  uint uVar9;
  rle16_t *local_40;
  int new_end;
  rle16_t local_24;
  rle16_t *appended_last_run;
  rle16_t *last_run;
  int old_end;
  uint16_t length_local;
  uint16_t start_local;
  run_container_t *src_local;
  
  if (src->n_runs == 0) {
    local_40 = (rle16_t *)0x0;
  }
  else {
    local_40 = src->runs + (src->n_runs + -1);
  }
  prVar8 = src->runs + src->n_runs;
  if ((src->n_runs == 0) ||
     (uVar9 = (uint)local_40->value + (uint)local_40->length + 1, uVar9 < start)) {
    local_24.length = length;
    local_24.value = start;
    *prVar8 = local_24;
    src->n_runs = src->n_runs + 1;
  }
  else if (uVar9 == start) {
    local_40->length = local_40->length + length + 1;
  }
  else {
    uVar7 = (uint)start + (uint)length + 1;
    uVar2 = (uint16_t)uVar7;
    uVar1 = (uint16_t)uVar9;
    if (start == local_40->value) {
      if (uVar7 < uVar9) {
        rVar3.length = (uVar1 - uVar2) - 1;
        rVar3.value = uVar2;
        *local_40 = rVar3;
      }
      else if (uVar9 < uVar7) {
        rVar4.length = (uVar2 - uVar1) - 1;
        rVar4.value = uVar1;
        *local_40 = rVar4;
      }
      else {
        src->n_runs = src->n_runs + -1;
      }
    }
    else {
      local_40->length = (start - local_40->value) - 1;
      if (uVar7 < uVar9) {
        rVar5.length = (uVar1 - uVar2) - 1;
        rVar5.value = uVar2;
        *prVar8 = rVar5;
        src->n_runs = src->n_runs + 1;
      }
      else if (uVar9 < uVar7) {
        rVar6.length = (uVar2 - uVar1) - 1;
        rVar6.value = uVar1;
        *prVar8 = rVar6;
        src->n_runs = src->n_runs + 1;
      }
    }
  }
  return;
}

Assistant:

void run_container_smart_append_exclusive(run_container_t *src,
                                          const uint16_t start,
                                          const uint16_t length) {
    int old_end;
    rle16_t *last_run = src->n_runs ? src->runs + (src->n_runs - 1) : NULL;
    rle16_t *appended_last_run = src->runs + src->n_runs;

    if (!src->n_runs ||
        (start > (old_end = last_run->value + last_run->length + 1))) {
        *appended_last_run = MAKE_RLE16(start, length);
        src->n_runs++;
        return;
    }
    if (old_end == start) {
        // we merge
        last_run->length += (length + 1);
        return;
    }
    int new_end = start + length + 1;

    if (start == last_run->value) {
        // wipe out previous
        if (new_end < old_end) {
            *last_run = MAKE_RLE16(new_end, old_end - new_end - 1);
            return;
        } else if (new_end > old_end) {
            *last_run = MAKE_RLE16(old_end, new_end - old_end - 1);
            return;
        } else {
            src->n_runs--;
            return;
        }
    }
    last_run->length = start - last_run->value - 1;
    if (new_end < old_end) {
        *appended_last_run = MAKE_RLE16(new_end, old_end - new_end - 1);
        src->n_runs++;
    } else if (new_end > old_end) {
        *appended_last_run = MAKE_RLE16(old_end, new_end - old_end - 1);
        src->n_runs++;
    }
}